

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

UMutableCPTrie * umutablecptrie_fromUCPTrie_63(UCPTrie *trie,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UErrorCode *pErrorCode_local;
  UCPTrie *trie_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (trie == (UCPTrie *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      trie_local = (UCPTrie *)0x0;
    }
    else {
      trie_local = (UCPTrie *)
                   icu_63::anon_unknown_0::MutableCodePointTrie::fromUCPTrie(trie,pErrorCode);
    }
  }
  else {
    trie_local = (UCPTrie *)0x0;
  }
  return (UMutableCPTrie *)trie_local;
}

Assistant:

U_CAPI UMutableCPTrie * U_EXPORT2
umutablecptrie_fromUCPTrie(const UCPTrie *trie, UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) {
        return nullptr;
    }
    if (trie == nullptr) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return nullptr;
    }
    return reinterpret_cast<UMutableCPTrie *>(MutableCodePointTrie::fromUCPTrie(trie, *pErrorCode));
}